

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

int __thiscall Imf_3_3::TiledInputFile::numLevels(TiledInputFile *this)

{
  LevelMode LVar1;
  ostream *poVar2;
  char *pcVar3;
  stringstream *text;
  element_type *peVar4;
  stringstream _iex_throw_s;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  LVar1 = levelMode((TiledInputFile *)0x190a41);
  if (LVar1 == RIPMAP_LEVELS) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_190);
    poVar2 = std::operator<<(local_180,"Error calling numLevels() on image file \"");
    pcVar3 = fileName((TiledInputFile *)0x190a7d);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\" (numLevels() is not defined for files with RIPMAP level mode).");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::LogicExc::LogicExc((LogicExc *)poVar2,text);
    __cxa_throw(text,&Iex_3_3::LogicExc::typeinfo,Iex_3_3::LogicExc::~LogicExc);
  }
  peVar4 = std::
           __shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x190b27);
  return peVar4->num_x_levels;
}

Assistant:

int
TiledInputFile::numLevels () const
{
    if (levelMode () == RIPMAP_LEVELS)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Error calling numLevels() on image "
            "file \""
                << fileName ()
                << "\" "
                   "(numLevels() is not defined for files "
                   "with RIPMAP level mode).");

    return _data->num_x_levels;
}